

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TokenStreamIOException.hpp
# Opt level: O0

void __thiscall antlr::TokenStreamIOException::~TokenStreamIOException(TokenStreamIOException *this)

{
  undefined8 *in_RDI;
  
  *in_RDI = &PTR__TokenStreamIOException_004fe3d8;
  std::exception::~exception((exception *)(in_RDI + 5));
  TokenStreamException::~TokenStreamException((TokenStreamException *)0x1798f4);
  return;
}

Assistant:

~TokenStreamIOException() throw()
	{
	}